

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
               (undefined8 param_1,undefined8 param_2)

{
  bool bVar1;
  reference ppVar2;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  *this;
  T tmp;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  sift_1;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  sift;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  cur;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  reference in_stack_ffffffffffffffb0;
  reference in_stack_ffffffffffffffb8;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_40;
  pair<int,_int> local_38;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_30;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_28;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_20 [2];
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = param_2;
  local_8 = param_1;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)in_stack_ffffffffffffffb0,
                     (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  if (!bVar1) {
    local_20[0] = __gnu_cxx::
                  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  ::operator+((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               *)in_stack_ffffffffffffffb8,
                              (difference_type)in_stack_ffffffffffffffb0);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)),
          bVar1) {
      local_28._M_current = local_20[0]._M_current;
      local_30 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator-((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              *)in_stack_ffffffffffffffb8,(difference_type)in_stack_ffffffffffffffb0
                            );
      in_stack_ffffffffffffffb8 =
           __gnu_cxx::
           __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
           ::operator*(&local_28);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator*(&local_30);
      bVar1 = std::less<std::pair<int,_int>_>::operator()
                        ((less<std::pair<int,_int>_> *)in_stack_ffffffffffffffb0,
                         (pair<int,_int> *)
                         CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                         (pair<int,_int> *)0x7d842d);
      if (bVar1) {
        ppVar2 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&local_28);
        local_38 = *ppVar2;
        do {
          in_stack_ffffffffffffffb0 =
               __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&local_30);
          local_40 = __gnu_cxx::
                     __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                     ::operator--((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                   *)in_stack_ffffffffffffffb8,
                                  (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
          ppVar2 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator*(&local_40);
          std::pair<int,_int>::operator=(ppVar2,in_stack_ffffffffffffffb0);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              *)in_stack_ffffffffffffffb0,
                             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
          in_stack_ffffffffffffffaf = false;
          if (bVar1) {
            this = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator--(&local_30);
            __gnu_cxx::
            __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            ::operator*(this);
            in_stack_ffffffffffffffaf =
                 std::less<std::pair<int,_int>_>::operator()
                           ((less<std::pair<int,_int>_> *)in_stack_ffffffffffffffb0,
                            (pair<int,_int> *)
                            CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                            (pair<int,_int> *)0x7d84c1);
          }
        } while ((bool)in_stack_ffffffffffffffaf != false);
        ppVar2 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&local_28);
        std::pair<int,_int>::operator=(ppVar2,&local_38);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(local_20);
    }
  }
  return;
}

Assistant:

inline void insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return;

        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
            }
        }
    }